

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

int disassemble_instruction(Vm *vm,int offset)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  
  printf("%04d ");
  puVar1 = ((vm->frames).frame_pointers[vm->frame_count - 1]->code_buffer).code;
  switch(puVar1[offset]) {
  case '\0':
    pcVar4 = "OP_NOP";
    break;
  case '\x01':
    pcVar4 = "OP_TRUE";
    break;
  case '\x02':
    pcVar4 = "OP_FALSE";
    break;
  case '\x03':
    pcVar4 = "OP_NIL";
    break;
  case '\x04':
    pcVar4 = "OP_ADD";
    break;
  case '\x05':
    pcVar4 = "OP_SUB";
    break;
  case '\x06':
    pcVar4 = "OP_MUL";
    break;
  case '\a':
    pcVar4 = "OP_DIV";
    break;
  case '\b':
    pcVar4 = "OP_MOD";
    break;
  case '\t':
    pcVar4 = "OP_POW";
    break;
  case '\n':
    pcVar4 = "OP_AND";
    break;
  case '\v':
    pcVar4 = "OP_OR";
    break;
  case '\f':
    pcVar4 = "OP_EQUAL";
    break;
  case '\r':
    pcVar4 = "OP_NOT_EQUAL";
    break;
  case '\x0e':
    pcVar4 = "OP_GT";
    break;
  case '\x0f':
    pcVar4 = "OP_LT";
    break;
  case '\x10':
    pcVar4 = "OP_GE";
    break;
  case '\x11':
    pcVar4 = "OP_LE";
    break;
  case '\x12':
    iVar2 = constant_instruction((char *)vm,(Vm *)(ulong)(uint)offset,0x1090c0);
    return iVar2;
  case '\x13':
    iVar2 = wide_constant_instruction((char *)vm,(Vm *)(ulong)(uint)offset,0x1090c0);
    return iVar2;
  case '\x14':
    pcVar4 = "OP_LDC_0";
    break;
  case '\x15':
    pcVar4 = "OP_LDC_1";
    break;
  case '\x16':
    uVar3 = (ulong)puVar1[(long)offset + 1];
    pcVar4 = "OP_STORE";
    goto LAB_00101d41;
  case '\x17':
    uVar3 = (ulong)puVar1[(long)offset + 1];
    pcVar4 = "OP_LOAD";
    goto LAB_00101d41;
  case '\x18':
    pcVar4 = "OP_LOAD_OFFSET";
    goto LAB_00101be7;
  case '\x19':
    pcVar4 = "OP_STORE_OFFSET";
LAB_00101be7:
    iVar2 = double_instruction(pcVar4,vm,offset);
    return iVar2;
  case '\x1a':
    pcVar4 = "OP_DUP";
    break;
  case '\x1b':
    pcVar4 = "OP_POP";
    break;
  case '\x1c':
    uVar3 = (ulong)puVar1[(long)offset + 1];
    pcVar4 = "OP_CALL";
LAB_00101d41:
    printf("%-16s %4d\n",pcVar4,uVar3);
    return offset + 2;
  case '\x1d':
    pcVar4 = "OP_NEGATE";
    break;
  case '\x1e':
    pcVar4 = "OP_NOT";
    break;
  case '\x1f':
    pcVar4 = "OP_PRINT";
    break;
  case ' ':
    pcVar4 = "OP_DICT_NEW";
    break;
  case '!':
    pcVar4 = "OP_LIST_NEW";
    break;
  case '\"':
    pcVar4 = "OP_LIST_APPEND";
    break;
  case '#':
    pcVar4 = "OP_STRUCT_SET";
    break;
  case '$':
    pcVar4 = "OP_STRUCT_GET";
    break;
  case '%':
    pcVar4 = "OP_STRUCT_PEEK";
    break;
  case '&':
    pcVar4 = "OP_JMP";
    goto LAB_00101d7e;
  case '\'':
    pcVar4 = "OP_JEQ";
    goto LAB_00101d7e;
  case '(':
    pcVar4 = "OP_JMT";
    goto LAB_00101d7e;
  case ')':
    pcVar4 = "OP_JMF";
    goto LAB_00101d7e;
  case '*':
    pcVar4 = "OP_JNE";
    goto LAB_00101d7e;
  case '+':
    pcVar4 = "OP_JLT";
    goto LAB_00101d7e;
  case ',':
    pcVar4 = "OP_JLE";
    goto LAB_00101d7e;
  case '-':
    pcVar4 = "OP_JGT";
    goto LAB_00101d7e;
  case '.':
    pcVar4 = "OP_JGE";
LAB_00101d7e:
    iVar2 = jump_instruction(pcVar4,vm,offset);
    return iVar2;
  case '/':
    pcVar4 = "OP_INC_1";
    break;
  case '0':
    pcVar4 = "OP_DEC_1";
    break;
  case '1':
    pcVar4 = "OP_RETURN";
    break;
  default:
    printf("Unknown instruction %d\n");
    goto LAB_00101d6b;
  }
  puts(pcVar4);
LAB_00101d6b:
  return offset + 1;
}

Assistant:

int disassemble_instruction(Vm *vm, int offset) {
    printf("%04d ", offset);

    uint8_t instruction = CURR_FRAME(vm)->code_buffer.code[offset];
    switch (instruction) {
        case OP_NOP:
            return simple_instruction("OP_NOP", offset);
        case OP_ADD:
            return simple_instruction("OP_ADD", offset);
        case OP_SUB:
            return simple_instruction("OP_SUB", offset);
        case OP_MUL:
            return simple_instruction("OP_MUL", offset);
        case OP_POW:
            return simple_instruction("OP_POW", offset);
        case OP_EQUAL:
            return simple_instruction("OP_EQUAL", offset);
        case OP_NOT_EQUAL:
            return simple_instruction("OP_NOT_EQUAL", offset);
        case OP_GT:
            return simple_instruction("OP_GT", offset);
        case OP_LT:
            return simple_instruction("OP_LT", offset);
        case OP_GE:
            return simple_instruction("OP_GE", offset);
        case OP_LE:
            return simple_instruction("OP_LE", offset);
        case OP_DIV:
            return simple_instruction("OP_DIV", offset);
        case OP_LDC:
            return constant_instruction("OP_LDC", vm, offset);
        case OP_LDC_W:
            return wide_constant_instruction("OP_LDC_W", vm, offset);
        case OP_NEGATE:
            return simple_instruction("OP_NEGATE", offset);
        case OP_STORE:
            return var_instruction("OP_STORE", vm, offset);
        case OP_LOAD:
            return var_instruction("OP_LOAD", vm, offset);
        case OP_LOAD_OFFSET:
            return double_instruction("OP_LOAD_OFFSET", vm, offset);
        case OP_STORE_OFFSET:
            return double_instruction("OP_STORE_OFFSET", vm, offset);
        case OP_DUP:
            return simple_instruction("OP_DUP", offset);
        case OP_POP:
            return simple_instruction("OP_POP", offset);
        case OP_RETURN:
            return simple_instruction("OP_RETURN", offset);
        case OP_JMP:
            return jump_instruction("OP_JMP", vm, offset);
        case OP_JEQ:
            return jump_instruction("OP_JEQ", vm, offset);
        case OP_JMT:
            return jump_instruction("OP_JMT", vm, offset);
        case OP_JMF:
            return jump_instruction("OP_JMF", vm, offset);
        case OP_JNE:
            return jump_instruction("OP_JNE", vm, offset);
        case OP_JLT:
            return jump_instruction("OP_JLT", vm, offset);
        case OP_JLE:
            return jump_instruction("OP_JLE", vm, offset);
        case OP_JGT:
            return jump_instruction("OP_JGT", vm, offset);
        case OP_JGE:
            return jump_instruction("OP_JGE", vm, offset);
        case OP_INC_1:
            return simple_instruction("OP_INC_1", offset);
        case OP_DEC_1:
            return simple_instruction("OP_DEC_1", offset);
        case OP_LDC_0:
            return simple_instruction("OP_LDC_0", offset);
        case OP_LDC_1:
            return simple_instruction("OP_LDC_1", offset);
        case OP_CALL:
            return var_instruction("OP_CALL", vm, offset);
        case OP_MOD:
            return simple_instruction("OP_MOD", offset);
        case OP_TRUE:
            return simple_instruction("OP_TRUE", offset);
        case OP_FALSE:
            return simple_instruction("OP_FALSE", offset);
        case OP_NIL:
            return simple_instruction("OP_NIL", offset);
        case OP_AND:
            return simple_instruction("OP_AND", offset);
        case OP_OR:
            return simple_instruction("OP_OR", offset);
        case OP_NOT:
            return simple_instruction("OP_NOT", offset);
        case OP_PRINT:
            return simple_instruction("OP_PRINT", offset);
        case OP_DICT_NEW:
            return simple_instruction("OP_DICT_NEW", offset);
        case OP_LIST_NEW:
            return simple_instruction("OP_LIST_NEW", offset);
        case OP_LIST_APPEND:
            return simple_instruction("OP_LIST_APPEND", offset);
        case OP_STRUCT_SET:
            return simple_instruction("OP_STRUCT_SET", offset);
        case OP_STRUCT_GET:
            return simple_instruction("OP_STRUCT_GET", offset);
        case OP_STRUCT_PEEK:
            return simple_instruction("OP_STRUCT_PEEK", offset);
        default:
            printf("Unknown instruction %d\n", instruction);
            return offset + 1;
    }
}